

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

void __thiscall glcts::LayoutBindingBaseCase::teardownTest(LayoutBindingBaseCase *this)

{
  Texture2DArray *this_00;
  Texture3D *this_01;
  _Base_ptr p_Var1;
  _Self __tmp;
  _Self __tmp_1;
  
  for (p_Var1 = (this->m_textures2D)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_textures2D)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_glu::Texture2D_*>,_std::_Select1st<std::pair<const_int,_glu::Texture2D_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
  ::clear(&(this->m_textures2D)._M_t);
  for (p_Var1 = (this->m_textures2DArray)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_textures2DArray)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = (Texture2DArray *)p_Var1[1]._M_parent;
    if (this_00 != (Texture2DArray *)0x0) {
      glu::Texture2DArray::~Texture2DArray(this_00);
    }
    operator_delete(this_00,0x70);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_glu::Texture2DArray_*>,_std::_Select1st<std::pair<const_int,_glu::Texture2DArray_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
  ::clear(&(this->m_textures2DArray)._M_t);
  for (p_Var1 = (this->m_textures3D)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_textures3D)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_01 = (Texture3D *)p_Var1[1]._M_parent;
    if (this_01 != (Texture3D *)0x0) {
      glu::Texture3D::~Texture3D(this_01);
    }
    operator_delete(this_01,0x70);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_glu::Texture3D_*>,_std::_Select1st<std::pair<const_int,_glu::Texture3D_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
  ::clear(&(this->m_textures3D)._M_t);
  return;
}

Assistant:

virtual void teardownTest()
	{
		for (Texture2DMap::iterator it = m_textures2D.begin(); it != m_textures2D.end(); it++)
		{
			delete it->second;
		}
		m_textures2D.clear();

		for (Texture2DArrayMap::iterator it = m_textures2DArray.begin(); it != m_textures2DArray.end(); it++)
		{
			delete it->second;
		}
		m_textures2DArray.clear();

		for (Texture3DMap::iterator it = m_textures3D.begin(); it != m_textures3D.end(); it++)
		{
			delete it->second;
		}
		m_textures3D.clear();
	}